

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_base64.c
# Opt level: O0

void cmime_base64_decode_file(FILE *infile,FILE *outfile)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int local_28;
  int local_24;
  int len;
  int i;
  uchar v;
  uchar out [3];
  uchar in [4];
  FILE *outfile_local;
  FILE *infile_local;
  
  _v = (FILE *)outfile;
  while (iVar1 = feof((FILE *)infile), iVar1 == 0) {
    local_28 = 0;
    local_24 = 0;
    while( true ) {
      bVar3 = false;
      if (local_24 < 4) {
        iVar1 = feof((FILE *)infile);
        bVar3 = iVar1 == 0;
      }
      if (!bVar3) break;
      len._0_1_ = '\0';
      while (iVar1 = feof((FILE *)infile), iVar1 == 0 && (char)len == '\0') {
        uVar2 = getc((FILE *)infile);
        if (((byte)uVar2 < 0x2b) || (0x7a < (byte)uVar2)) {
          len._0_1_ = '\0';
        }
        else {
          len._0_1_ = "|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                      [(int)((uVar2 & 0xff) - 0x2b)];
        }
        if ((char)len != '\0') {
          if ((char)len == '$') {
            len._0_1_ = '\0';
          }
          else {
            len._0_1_ = (char)len + -0x3d;
          }
        }
      }
      iVar1 = feof((FILE *)infile);
      if (iVar1 == 0) {
        local_28 = local_28 + 1;
        if ((char)len != '\0') {
          *(char *)((long)&i + (long)local_24) = (char)len + -1;
        }
      }
      else {
        *(undefined1 *)((long)&i + (long)local_24) = 0;
      }
      local_24 = local_24 + 1;
    }
    if (local_28 != 0) {
      cmime_base64_decode_block((uchar *)&i,(uchar *)((long)&len + 1));
      for (local_24 = 0; local_24 < local_28 + -1; local_24 = local_24 + 1) {
        putc((uint)*(byte *)((long)&len + (long)local_24 + 1),_v);
      }
    }
  }
  return;
}

Assistant:

void cmime_base64_decode_file(FILE *infile, FILE *outfile) {
    unsigned char in[4], out[3], v;
    int i, len;

    while(!feof(infile)) {
        for(len = 0, i = 0; i < 4 && !feof(infile); i++) {
            v = 0;
            while(!feof(infile) && (v == 0)) {
                v = (unsigned char) getc( infile );
                v = (unsigned char) ((v < 43 || v > 122) ? 0 : cd64[ v - 43 ]);
                if( v ) {
                    v = (unsigned char) ((v == '$') ? 0 : v - 61);
                }
            }
            
            if(!feof(infile)) {
                len++;
                if(v) {
                    in[ i ] = (unsigned char) (v - 1);
                }
            } else {
                in[i] = 0;
            }
        }
        if(len) {
            cmime_base64_decode_block(in, out);
            for(i = 0; i < len - 1; i++) {
                putc(out[i], outfile);
            }
    }
    }
}